

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::DestroyString(void *s)

{
  if (*s != (long *)((long)s + 0x10)) {
    operator_delete(*s,*(long *)((long)s + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

void DestroyString(const void* s) {
  static_cast<const std::string*>(s)->~basic_string();
}